

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void commit_x4(uint8_t **digest,uint8_t **seed,uint8_t *salt,size_t t,size_t j,
              picnic_instance_t *params)

{
  uint16_t j_arr [4];
  hash_context_x4 ctx;
  
  hash_init_x4(&ctx,(ulong)params->digest_size);
  hash_update_x4(&ctx,seed,(ulong)params->seed_size);
  hash_update_x4_1(&ctx,salt,0x20);
  hash_update_x4_uint16_le(&ctx,(uint16_t)t);
  j_arr[0] = (uint16_t)j;
  j_arr[1] = j_arr[0] + 1;
  j_arr[2] = j_arr[0] + 2;
  j_arr[3] = j_arr[0] + 3;
  hash_update_x4_uint16s_le(&ctx,j_arr);
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx,digest,(ulong)params->digest_size);
  return;
}

Assistant:

static void commit_x4(uint8_t** digest, const uint8_t** seed, const uint8_t* salt, size_t t,
                      size_t j, const picnic_instance_t* params) {
  /* Compute C[t][j];  as digest = H(seed||[aux]) aux is optional */
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  hash_update_x4(&ctx, seed, params->seed_size);
  hash_update_x4_1(&ctx, salt, SALT_SIZE);
  hash_update_x4_uint16_le(&ctx, t);
  const uint16_t j_arr[4] = {j + 0, j + 1, j + 2, j + 3};
  hash_update_x4_uint16s_le(&ctx, j_arr);
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}